

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenArrayCopySetLength(BinaryenExpressionRef expr,BinaryenExpressionRef lengthExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef lengthExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::ArrayCopy>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<ArrayCopy>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x118b,
                  "void BinaryenArrayCopySetLength(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (lengthExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 3) = lengthExpr;
    return;
  }
  __assert_fail("lengthExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x118c,
                "void BinaryenArrayCopySetLength(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenArrayCopySetLength(BinaryenExpressionRef expr,
                                BinaryenExpressionRef lengthExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArrayCopy>());
  assert(lengthExpr);
  static_cast<ArrayCopy*>(expression)->length = (Expression*)lengthExpr;
}